

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.cpp
# Opt level: O2

void __thiscall Imf_2_5::ChannelList::insert(ChannelList *this,char *name,Channel *channel)

{
  undefined8 uVar1;
  int iVar2;
  mapped_type *pmVar3;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  ostream local_190 [376];
  
  if (*name != '\0') {
    Name::Name((Name *)&_iex_throw_s,name);
    pmVar3 = std::
             map<Imf_2_5::Name,_Imf_2_5::Channel,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
             ::operator[](&this->_map,(key_type *)&_iex_throw_s);
    iVar2 = channel->xSampling;
    uVar1 = *(undefined8 *)((long)&channel->xSampling + 1);
    pmVar3->type = channel->type;
    pmVar3->xSampling = iVar2;
    *(undefined8 *)((long)&pmVar3->xSampling + 1) = uVar1;
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  std::operator<<(local_190,"Image channel name cannot be an empty string.");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void	
ChannelList::insert (const char name[], const Channel &channel)
{
    if (name[0] == 0)
	THROW (IEX_NAMESPACE::ArgExc, "Image channel name cannot be an empty string.");

    _map[name] = channel;
}